

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::LabelTests_PrintHieroMixed2_Test::TestBody(LabelTests_PrintHieroMixed2_Test *this)

{
  SpanPair sp;
  bool bVar1;
  reference pvVar2;
  char *message;
  char *in_RCX;
  string_view line;
  AssertHelper local_320;
  Message local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar;
  SpanPair nt;
  NT local_2c0;
  string_view local_2a8;
  undefined2 local_298;
  undefined2 uStack_296;
  undefined2 uStack_294;
  IndexType IStack_292;
  NT local_290;
  undefined1 local_278 [8];
  PhrasalRule rule;
  ostringstream local_1e0 [8];
  ostringstream s;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined1 local_58 [8];
  AlignedSentencePair asp;
  LabelTests_PrintHieroMixed2_Test *this_local;
  
  asp.alignment.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_68,"a c\tb d e\t0-0");
  line._M_str = in_RCX;
  line._M_len = (size_t)local_68._M_str;
  readAlignedSentencePair<false,false>
            ((AlignedSentencePair *)local_58,(thrax *)local_68._M_len,line);
  std::__cxx11::ostringstream::ostringstream(local_1e0);
  PhrasalRule::PhrasalRule((PhrasalRule *)local_278,(AlignedSentencePair *)local_58);
  local_298 = 0;
  uStack_296 = 1;
  uStack_294 = 0;
  IStack_292 = 1;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2a8,"X");
  sp.src.end = uStack_296;
  sp.src.start = local_298;
  sp.tgt.start = uStack_294;
  sp.tgt.end = IStack_292;
  NT::NT(&local_290,sp,local_2a8);
  pvVar2 = std::array<jhu::thrax::NT,_4UL>::operator[]((array<jhu::thrax::NT,_4UL> *)local_278,0);
  (pvVar2->label)._M_str = local_290.label._M_str;
  pvVar2->span = local_290.span;
  (pvVar2->label)._M_len = local_290.label._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&nt,"X");
  NT::NT(&local_2c0,(SpanPair)0x3000200020001,_nt);
  pvVar2 = std::array<jhu::thrax::NT,_4UL>::operator[]((array<jhu::thrax::NT,_4UL> *)local_278,1);
  (pvVar2->label)._M_str = local_2c0.label._M_str;
  pvVar2->span = local_2c0.span;
  (pvVar2->label)._M_len = local_2c0.label._M_len;
  pvVar2 = std::array<jhu::thrax::NT,_4UL>::operator[]((array<jhu::thrax::NT,_4UL> *)local_278,0);
  gtest_ar.message_.ptr_ =
       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&pvVar2->span;
  pvVar2 = std::array<jhu::thrax::NT,_4UL>::operator[]((array<jhu::thrax::NT,_4UL> *)local_278,1);
  gtest_ar.message_.ptr_ =
       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&pvVar2->span;
  thrax::operator<<((ostream *)local_1e0,(PhrasalRule *)local_278);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper<false>::Compare<char[31],std::__cxx11::string>
            ((EqHelper<false> *)local_2f0,"\"[X]\\t[X,1] [X,2]\\t[X,1] d [X,2]\\t\"","s.str()",
             (char (*) [31])"[X]\t[X,1] [X,2]\t[X,1] d [X,2]\t",&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/label_test.cpp"
               ,0x48,message);
    testing::internal::AssertHelper::operator=(&local_320,&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  std::__cxx11::ostringstream::~ostringstream(local_1e0);
  AlignedSentencePair::~AlignedSentencePair((AlignedSentencePair *)local_58);
  return;
}

Assistant:

TEST(LabelTests, PrintHieroMixed2) {
  auto asp = readAlignedSentencePair<false, false>("a c\tb d e\t0-0");
  std::ostringstream s;
  PhrasalRule rule{asp};
  rule.nts[0] = NT({{0, 1}, {0, 1}}, "X");
  rule.nts[1] = NT({{1, 2}, {2, 3}}, "X");
  auto nt = rule.nts[0].span;
  nt = rule.nts[1].span;
  s << rule;
  EXPECT_EQ("[X]\t[X,1] [X,2]\t[X,1] d [X,2]\t", s.str());
}